

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

void inform_decode(int32_t encoding,int b,int *state,size_t n,inform_error *err)

{
  ulong local_30;
  size_t i;
  inform_error *err_local;
  size_t n_local;
  int *state_local;
  int b_local;
  int32_t encoding_local;
  
  if (encoding < 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EARG;
    }
  }
  else if (b < 2) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EBASE;
    }
  }
  else if ((state == (int *)0x0) || (n == 0)) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EARG;
    }
  }
  else {
    state_local._4_4_ = encoding;
    for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
      state[(n - local_30) + -1] = state_local._4_4_ % b;
      state_local._4_4_ = state_local._4_4_ / b;
    }
    if ((state_local._4_4_ != 0) && (err != (inform_error *)0x0)) {
      *err = INFORM_EENCODE;
    }
  }
  return;
}

Assistant:

void inform_decode(int32_t encoding, int b, int *state, size_t n, inform_error *err)
{
    if (encoding < 0)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EARG);
    else if (b < 2)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EBASE);
    else if (state == NULL || n == 0)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EARG);

    for (size_t i = 0; i < n; ++i, encoding /= b)
        state[n - i - 1] = encoding % b;

    if (encoding != 0)
        INFORM_ERROR_RETURN_VOID(err, INFORM_EENCODE);
}